

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limits.cpp
# Opt level: O2

size_t fs_get_max_path(void)

{
  return 0x1000;
}

Assistant:

std::size_t
fs_get_max_path()
{
// Returns the maximum path length supported by the file system.
  std::size_t m = DEFAULT_MAX_PATH;
#if defined(PATH_MAX)
  // POSIX
  m = PATH_MAX;
#elif defined(_MAX_PATH)
  // https://learn.microsoft.com/en-us/cpp/c-runtime-library/path-field-limits
  m = _MAX_PATH;
#elif defined(_POSIX_PATH_MAX)
  m = _POSIX_PATH_MAX;
#endif
  // arbitrary absolute maximum
  // Ref: https://github.com/gulrak/filesystem/blob/b1982f06c84f08a99fb90bac43c2d03712efe921/include/ghc/filesystem.hpp#L244
  return (m < 4096) ? m : 4096;
}